

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int buffer_realloc(BUFFER *buf,size_t alloc)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  iVar3 = 0;
  if (buf->alloc != alloc) {
    iVar3 = iVar2;
    if (alloc == 0) {
      free(buf->data);
      buf->data = (void *)0x0;
      buf->size = 0;
      buf->alloc = 0;
    }
    else {
      pvVar1 = realloc(buf->data,alloc);
      if (pvVar1 == (void *)0x0) {
        iVar3 = -1;
      }
      else {
        buf->data = pvVar1;
        buf->alloc = alloc;
        if (alloc < buf->size) {
          buf->size = alloc;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
buffer_realloc(BUFFER* buf, size_t alloc)
{
    void* tmp;

    if(alloc == buf->alloc)
        return 0;

    if(alloc == 0) {
        free(buf->data);
        buffer_init(buf);
        return 0;
    }

    tmp = realloc(buf->data, alloc);
    if(tmp == NULL)
        return -1;

    buf->data = tmp;
    buf->alloc = alloc;
    if(alloc < buf->size)
        buf->size = alloc;
    return 0;
}